

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O2

uint32_t helper_clcl(CPUS390XState_conflict *env,uint32_t r1,uint32_t r2)

{
  uint uVar1;
  ulong uVar2;
  uint32_t uVar3;
  uint uVar4;
  uintptr_t unaff_retaddr;
  uint64_t src3len;
  uint64_t src1;
  uint64_t src1len;
  uintptr_t local_48;
  ulong local_40;
  uint64_t src3;
  
  uVar1 = r1 + 1;
  src1len = env->regs[uVar1] & 0xffffff;
  local_48 = unaff_retaddr;
  src1 = get_address(env,r1);
  uVar4 = r2 + 1;
  uVar2 = env->regs[uVar4];
  src3len = uVar2 & 0xffffff;
  local_40 = (ulong)r2;
  src3 = get_address(env,r2);
  uVar3 = do_clcl(env,&src1,&src1len,&src3,&src3len,(ushort)(uVar2 >> 0x18) & 0xff,
                  0xffffffffffffffff,1,local_48);
  env->regs[uVar1] = src1len & 0xffffff | env->regs[uVar1] & 0xffffffffff000000;
  env->regs[uVar4] = src3len & 0xffffff | env->regs[uVar4] & 0xffffffffff000000;
  set_address(env,r1,src1);
  set_address(env,(int)local_40,src3);
  return uVar3;
}

Assistant:

uint32_t HELPER(clcl)(CPUS390XState *env, uint32_t r1, uint32_t r2)
{
    uintptr_t ra = GETPC();
    uint64_t src1len = extract64(env->regs[r1 + 1], 0, 24);
    uint64_t src1 = get_address(env, r1);
    uint64_t src3len = extract64(env->regs[r2 + 1], 0, 24);
    uint64_t src3 = get_address(env, r2);
    uint8_t pad = env->regs[r2 + 1] >> 24;
    uint32_t cc;

    cc = do_clcl(env, &src1, &src1len, &src3, &src3len, pad, -1, 1, ra);

    env->regs[r1 + 1] = deposit64(env->regs[r1 + 1], 0, 24, src1len);
    env->regs[r2 + 1] = deposit64(env->regs[r2 + 1], 0, 24, src3len);
    set_address(env, r1, src1);
    set_address(env, r2, src3);

    return cc;
}